

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O1

FileDescriptor * __thiscall
ASDCP::MXF::FileDescriptor::InitFromTLVSet(FileDescriptor *this,TLVReader *TLVSet)

{
  MDDEntry *pMVar1;
  MDDEntry *in_RDX;
  TLVReader local_80;
  
  if (TLVSet[1].super_MemIOReader.m_p != (byte_t *)0x0) {
    GenericDescriptor::InitFromTLVSet(&this->super_GenericDescriptor,TLVSet);
    if (-1 < *(int *)&(this->super_GenericDescriptor).super_InterchangeObject.super_KLVPacket.
                      _vptr_KLVPacket) {
      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                MDD_FileDescriptor_LinkedTrackID);
      TLVReader::ReadUi32(&local_80,in_RDX,(ui32_t *)pMVar1);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
      *(bool *)&TLVSet[3].super_MemIOReader.m_size =
           *(int *)&(this->super_GenericDescriptor).super_InterchangeObject.super_KLVPacket.
                    _vptr_KLVPacket == Kumu::RESULT_OK;
    }
    if (-1 < *(int *)&(this->super_GenericDescriptor).super_InterchangeObject.super_KLVPacket.
                      _vptr_KLVPacket) {
      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                MDD_FileDescriptor_SampleRate);
      TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar1);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
    }
    if (-1 < *(int *)&(this->super_GenericDescriptor).super_InterchangeObject.super_KLVPacket.
                      _vptr_KLVPacket) {
      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                MDD_FileDescriptor_ContainerDuration);
      TLVReader::ReadUi64(&local_80,in_RDX,(ui64_t *)pMVar1);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
      *(bool *)&TLVSet[3].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           *(int *)&(this->super_GenericDescriptor).super_InterchangeObject.super_KLVPacket.
                    _vptr_KLVPacket == Kumu::RESULT_OK;
    }
    if (-1 < *(int *)&(this->super_GenericDescriptor).super_InterchangeObject.super_KLVPacket.
                      _vptr_KLVPacket) {
      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                MDD_FileDescriptor_EssenceContainer);
      TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar1);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
    }
    if (-1 < *(int *)&(this->super_GenericDescriptor).super_InterchangeObject.super_KLVPacket.
                      _vptr_KLVPacket) {
      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                MDD_FileDescriptor_Codec);
      TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar1);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
      *(bool *)&TLVSet[4].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           *(int *)&(this->super_GenericDescriptor).super_InterchangeObject.super_KLVPacket.
                    _vptr_KLVPacket == Kumu::RESULT_OK;
    }
    return this;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x568,
                "virtual ASDCP::Result_t ASDCP::MXF::FileDescriptor::InitFromTLVSet(TLVReader &)");
}

Assistant:

ASDCP::Result_t
FileDescriptor::InitFromTLVSet(TLVReader& TLVSet)
{
  assert(m_Dict);
  Result_t result = GenericDescriptor::InitFromTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi32(OBJ_READ_ARGS_OPT(FileDescriptor, LinkedTrackID));
    LinkedTrackID.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(FileDescriptor, SampleRate));
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi64(OBJ_READ_ARGS_OPT(FileDescriptor, ContainerDuration));
    ContainerDuration.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(FileDescriptor, EssenceContainer));
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(FileDescriptor, Codec));
    Codec.set_has_value( result == RESULT_OK );
  }
  return result;
}